

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O3

int Pla_ReadPlaHeader(char *pBuffer,char *pLimit,int *pnIns,int *pnOuts,int *pnCubes,int *pType)

{
  int iVar1;
  uint uVar2;
  char *__nptr;
  char *pcVar3;
  char Buffer [100];
  undefined4 local_98;
  
  *pType = 0;
  *pnCubes = -1;
  *pnOuts = -1;
  *pnIns = -1;
  if (pBuffer < pLimit) {
    __nptr = pBuffer + 3;
    do {
      if (__nptr[-3] == '.') {
        if ((__nptr[-2] == 'i') && (__nptr[-1] == ' ')) {
          iVar1 = atoi(__nptr);
          *pnIns = iVar1;
        }
        else if ((__nptr[-2] == 'o') && (__nptr[-1] == ' ')) {
          iVar1 = atoi(__nptr);
          *pnOuts = iVar1;
        }
        else if ((__nptr[-2] == 'p') && (__nptr[-1] == ' ')) {
          iVar1 = atoi(__nptr);
          *pnCubes = iVar1;
        }
        else {
          if ((__nptr[-2] == 'e') && (__nptr[-1] == ' ')) break;
          iVar1 = strncmp(__nptr + -3,".type ",6);
          if (iVar1 == 0) {
            *pType = 4;
            __isoc99_sscanf(__nptr + 3,"%s",&local_98);
            iVar1 = 1;
            if ((short)local_98 != 0x66) {
              if (local_98._2_1_ == '\0' && (short)local_98 == 0x7266) {
                iVar1 = 2;
              }
              else if (local_98._2_1_ == '\0' && (short)local_98 == 0x6466) {
                iVar1 = 0;
              }
              else {
                iVar1 = 3;
                if (local_98 != 0x726466) goto LAB_0035f2fa;
              }
            }
            *pType = iVar1;
          }
        }
      }
LAB_0035f2fa:
      pcVar3 = __nptr + -2;
      __nptr = __nptr + 1;
    } while (pcVar3 != pLimit);
    if (0 < *pnIns) goto LAB_0035f320;
  }
  puts("The number of inputs (.i) should be positive.");
LAB_0035f320:
  if (*pnOuts < 1) {
    puts("The number of outputs (.o) should be positive.");
  }
  if (*pnIns < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(0 < *pnOuts);
  }
  return uVar2;
}

Assistant:

int Pla_ReadPlaHeader( char * pBuffer, char * pLimit, int * pnIns, int * pnOuts, int * pnCubes, int * pType )
{
    char * pTemp; 
    *pType = PLA_FILE_FD;
    *pnIns = *pnOuts = *pnCubes = -1;
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp != '.' )
            continue;
        if ( !strncmp(pTemp, ".i ", 3) )
            *pnIns = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".o ", 3) )
            *pnOuts = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".p ", 3) )
            *pnCubes = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".e ", 3) )
            break;
        else if ( !strncmp(pTemp, ".type ", 6) )
        {
            char Buffer[100];
            *pType = PLA_FILE_NONE;
            sscanf( pTemp+6, "%s", Buffer );
            if ( !strcmp(Buffer, "f") )
                *pType = PLA_FILE_F;
            else if ( !strcmp(Buffer, "fr") )
                *pType = PLA_FILE_FR;
            else if ( !strcmp(Buffer, "fd") )
                *pType = PLA_FILE_FD;
            else if ( !strcmp(Buffer, "fdr") )
                *pType = PLA_FILE_FDR;
        }
    }
    if ( *pnIns <= 0 )
        printf( "The number of inputs (.i) should be positive.\n" );
    if ( *pnOuts <= 0 )
        printf( "The number of outputs (.o) should be positive.\n" );
    return *pnIns > 0 && *pnOuts > 0;
}